

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Function.h
# Opt level: O2

basic_string<char,_std::char_traits<char>,_std::allocator<char>_> * __thiscall
slang::function_ref<std::__cxx11::string()>::
callback_fn<slang::TimeTrace::beginTrace(std::basic_string_view<char,std::char_traits<char>>,std::basic_string_view<char,std::char_traits<char>>)::__0>
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__return_storage_ptr__
          ,function_ref<std::__cxx11::string()> *this,intptr_t callable)

{
  allocator<char> local_9;
  
  std::__cxx11::string::string<std::basic_string_view<char,std::char_traits<char>>,void>
            ((string *)__return_storage_ptr__,
             *(basic_string_view<char,_std::char_traits<char>_> **)this,&local_9);
  return __return_storage_ptr__;
}

Assistant:

static Ret callback_fn(intptr_t callable, Params... params) {
        return (*reinterpret_cast<Callable*>(callable))(std::forward<Params>(params)...);
    }